

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O2

int BuildMapUaToAa(TIFFRGBAImage *img)

{
  uint8_t *puVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  
  if (img->UaToAa == (uint8_t *)0x0) {
    puVar1 = (uint8_t *)_TIFFmallocExt(img->tif,0x10000);
    img->UaToAa = puVar1;
    if (puVar1 == (uint8_t *)0x0) {
      iVar2 = 0;
      TIFFErrorExtR(img->tif,"BuildMapUaToAa","Out of memory");
    }
    else {
      iVar2 = 1;
      for (iVar4 = 0; iVar4 != 0x100; iVar4 = iVar4 + 1) {
        uVar3 = 0x7f;
        for (lVar5 = 0; (int)lVar5 != 0x100; lVar5 = lVar5 + 1) {
          puVar1[lVar5] = (uint8_t)(uVar3 / 0xff);
          uVar3 = (ulong)(uint)((int)uVar3 + iVar4);
        }
        puVar1 = puVar1 + lVar5;
      }
    }
    return iVar2;
  }
  __assert_fail("img->UaToAa == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_getimage.c"
                ,0xc50,"int BuildMapUaToAa(TIFFRGBAImage *)");
}

Assistant:

static int BuildMapUaToAa(TIFFRGBAImage *img)
{
    static const char module[] = "BuildMapUaToAa";
    uint8_t *m;
    uint16_t na, nv;
    assert(img->UaToAa == NULL);
    img->UaToAa = _TIFFmallocExt(img->tif, 65536);
    if (img->UaToAa == NULL)
    {
        TIFFErrorExtR(img->tif, module, "Out of memory");
        return (0);
    }
    m = img->UaToAa;
    for (na = 0; na < 256; na++)
    {
        for (nv = 0; nv < 256; nv++)
            *m++ = (uint8_t)((nv * na + 127) / 255);
    }
    return (1);
}